

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

int __thiscall spdlog::details::registry::shutdown(registry *this,int __fd,int __how)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->flusher_mutex_);
  if (iVar1 == 0) {
    std::
    __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
    ::reset((__uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
             *)&this->periodic_flusher_,(pointer)0x0);
    pthread_mutex_unlock((pthread_mutex_t *)&this->flusher_mutex_);
    drop_all(this);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->tp_mutex_);
    if (iVar1 == 0) {
      this_00 = (this->tp_).
                super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->tp_).super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->tp_).super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->tp_mutex_);
      return iVar1;
    }
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void registry::shutdown() {
    {
        std::lock_guard<std::mutex> lock(flusher_mutex_);
        periodic_flusher_.reset();
    }

    drop_all();

    {
        std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
        tp_.reset();
    }
}